

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O1

Vector4f __thiscall Vector4f::normalized(Vector4f *this)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RSI) [16];
  float fVar2;
  undefined1 auVar3 [16];
  Vector4f VVar4;
  
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(*(float *)(*in_RSI + 4) * *(float *)(*in_RSI + 4))),
                           ZEXT416(*(uint *)*in_RSI),ZEXT416(*(uint *)*in_RSI));
  auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(*in_RSI + 8)),ZEXT416(*(uint *)(*in_RSI + 8)),auVar1);
  auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(*in_RSI + 0xc)),ZEXT416(*(uint *)(*in_RSI + 0xc)),
                           auVar1);
  if (auVar1._0_4_ < 0.0) {
    fVar2 = sqrtf(auVar1._0_4_);
  }
  else {
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    fVar2 = auVar1._0_4_;
  }
  auVar1 = *in_RSI;
  auVar3._4_4_ = fVar2;
  auVar3._0_4_ = fVar2;
  auVar3._8_4_ = fVar2;
  auVar3._12_4_ = fVar2;
  auVar3 = vdivps_avx(auVar1,auVar3);
  *(undefined1 (*) [16])this->m_elements = auVar3;
  VVar4.m_elements._0_8_ = auVar3._0_8_;
  VVar4.m_elements._8_8_ = auVar1._0_8_;
  return (Vector4f)VVar4.m_elements;
}

Assistant:

Vector4f Vector4f::normalized() const
{
	float length = abs();
	return Vector4f
		(
			m_elements[0] / length,
			m_elements[1] / length,
			m_elements[2] / length,
			m_elements[3] / length
		);
}